

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,X509 *server_cert)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  stack_st_GENERAL_NAME *__n;
  stack_st_GENERAL_NAME *psVar5;
  X509_NAME *name_00;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__dest;
  void *__src;
  size_t uznum;
  byte local_d1;
  char *local_d0;
  char *local_c8;
  ASN1_STRING *tmp;
  int j;
  X509_NAME *name;
  uchar *puStack_a0;
  int peerlen;
  uchar *peer_CN;
  stack_st_GENERAL_NAME *psStack_90;
  int i_1;
  size_t altlen;
  char *altptr;
  GENERAL_NAME *check;
  int local_70;
  _Bool ipmatched;
  int iStack_6c;
  _Bool dnsmatched;
  int i;
  int numalts;
  size_t hostlen;
  char *dispname;
  char *hostname;
  undefined1 local_48 [2];
  _Bool iPAddress;
  _Bool dNSName;
  CURLcode result;
  in6_addr addr;
  stack_st_GENERAL_NAME *altnames;
  size_t addrlen;
  int target;
  _Bool matched;
  X509 *server_cert_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bVar1 = false;
  addrlen._0_4_ = 2;
  altnames = (stack_st_GENERAL_NAME *)0x0;
  hostname._4_4_ = CURLE_OK;
  hostname._3_1_ = 0;
  hostname._2_1_ = 0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_c8 = (conn->http_proxy).host.name;
  }
  else {
    local_c8 = (conn->host).name;
  }
  dispname = local_c8;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_d0 = (conn->http_proxy).host.dispname;
  }
  else {
    local_d0 = (conn->host).dispname;
  }
  hostlen = (size_t)local_d0;
  _i = strlen(local_c8);
  if (((*(uint *)&(conn->bits).field_0x4 >> 0xb & 1) == 0) ||
     (iVar3 = inet_pton(10,dispname,local_48), iVar3 == 0)) {
    iVar3 = inet_pton(2,dispname,local_48);
    if (iVar3 != 0) {
      addrlen._0_4_ = 7;
      altnames = (stack_st_GENERAL_NAME *)0x4;
    }
  }
  else {
    addrlen._0_4_ = 7;
    altnames = (stack_st_GENERAL_NAME *)0x10;
  }
  addr.__in6_u._8_8_ = X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if ((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_ != (stack_st_GENERAL_NAME *)0x0) {
    check._7_1_ = 0;
    check._6_1_ = 0;
    pOVar4 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
    iStack_6c = OPENSSL_sk_num(pOVar4);
    local_70 = 0;
    while( true ) {
      local_d1 = 0;
      if (local_70 < iStack_6c) {
        local_d1 = check._7_1_ ^ 0xff;
      }
      if ((local_d1 & 1) == 0) break;
      pOVar4 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
      altptr = (char *)OPENSSL_sk_value(pOVar4,local_70);
      if (*(int *)altptr == 2) {
        hostname._3_1_ = 1;
      }
      else if (*(int *)altptr == 7) {
        hostname._2_1_ = 1;
      }
      if (*(int *)altptr == (int)addrlen) {
        altlen = ASN1_STRING_get0_data(*(undefined8 *)((long)altptr + 8));
        iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(altptr + 8));
        __n = (stack_st_GENERAL_NAME *)(long)iVar3;
        psStack_90 = __n;
        if ((int)addrlen == 2) {
          psVar5 = (stack_st_GENERAL_NAME *)strlen((char *)altlen);
          if ((__n == psVar5) &&
             (_Var2 = subj_alt_hostcheck(data,(char *)altlen,(size_t)psStack_90,dispname,_i,
                                         (char *)hostlen), _Var2)) {
            check._7_1_ = 1;
          }
        }
        else if ((((int)addrlen == 7) && (__n == altnames)) &&
                (iVar3 = memcmp((void *)altlen,local_48,(size_t)__n), iVar3 == 0)) {
          check._6_1_ = 1;
          Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",hostlen);
        }
      }
      local_70 = local_70 + 1;
    }
    GENERAL_NAMES_free((GENERAL_NAMES *)addr.__in6_u._8_8_);
    if (((check._7_1_ & 1) != 0) || ((check._6_1_ & 1) != 0)) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    if (((hostname._3_1_ & 1) == 0) && ((hostname._2_1_ & 1) == 0)) {
      peer_CN._4_4_ = -1;
      puStack_a0 = (uchar *)0x0;
      name._4_4_ = 0;
      name_00 = X509_get_subject_name((X509 *)server_cert);
      iVar3 = peer_CN._4_4_;
      if (name_00 != (X509_NAME *)0x0) {
        do {
          peer_CN._4_4_ = iVar3;
          iVar3 = X509_NAME_get_index_by_NID(name_00,0xd,peer_CN._4_4_);
        } while (-1 < iVar3);
      }
      if (-1 < peer_CN._4_4_) {
        ne = X509_NAME_get_entry(name_00,peer_CN._4_4_);
        x = X509_NAME_ENTRY_get_data(ne);
        if (x != (ASN1_STRING *)0x0) {
          iVar3 = ASN1_STRING_type(x);
          if (iVar3 == 0xc) {
            name._4_4_ = ASN1_STRING_length(x);
            if (-1 < name._4_4_) {
              __dest = (uchar *)CRYPTO_malloc(name._4_4_ + 1,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                              ,0x867);
              puStack_a0 = __dest;
              if (__dest == (uchar *)0x0) {
                hostname._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                __src = (void *)ASN1_STRING_get0_data(x);
                memcpy(__dest,__src,(long)name._4_4_);
                puStack_a0[name._4_4_] = '\0';
              }
            }
          }
          else {
            name._4_4_ = ASN1_STRING_to_UTF8(&stack0xffffffffffffff60,x);
          }
          if (puStack_a0 != (uchar *)0x0) {
            uznum = strlen((char *)puStack_a0);
            iVar3 = curlx_uztosi(uznum);
            if (iVar3 != name._4_4_) {
              Curl_failf(data,"SSL: illegal cert name field");
              hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
        }
      }
      if (hostname._4_4_ == CURLE_OK) {
        if (puStack_a0 == (uchar *)0x0) {
          Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
          hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
        }
        else {
          _Var2 = Curl_cert_hostcheck((char *)puStack_a0,(long)name._4_4_,dispname,_i);
          if (_Var2) {
            Curl_infof(data," common name: %s (matched)",puStack_a0);
          }
          else {
            Curl_failf(data,
                       "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                       ,puStack_a0,hostlen);
            hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
          }
        }
      }
      if (puStack_a0 != (uchar *)0x0) {
        CRYPTO_free(puStack_a0);
      }
    }
    else {
      Curl_infof(data," subjectAltName does not match %s",hostlen);
      Curl_failf(data,"SSL: no alternative certificate subject name matches target host name \'%s\'"
                 ,hostlen);
      hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  return hostname._4_4_;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  const char * const hostname = SSL_HOST_NAME();
  const char * const dispname = SSL_HOST_DISPNAME();
  size_t hostlen = strlen(hostname);

#ifdef ENABLE_IPV6
  if(conn->bits.ipv6_ip &&
     Curl_inet_pton(AF_INET6, hostname, &addr)) {
    target = GEN_IPADD;
    addrlen = sizeof(struct in6_addr);
  }
  else
#endif
    if(Curl_inet_pton(AF_INET, hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in_addr);
    }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#ifdef OPENSSL_IS_BORINGSSL
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data,
                                altptr,
                                altlen, hostname, hostlen, dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}